

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

void __thiscall QPlainTextEditPrivate::updateViewport(QPlainTextEditPrivate *this)

{
  QPlainTextEdit *this_00;
  long in_FS_OFFSET;
  QRect local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEdit **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  QWidget::update((this->super_QAbstractScrollAreaPrivate).viewport);
  local_28 = QWidget::rect((this->super_QAbstractScrollAreaPrivate).viewport);
  QPlainTextEdit::updateRequest(this_00,&local_28,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEditPrivate::updateViewport()
{
    Q_Q(QPlainTextEdit);
    viewport->update();
    emit q->updateRequest(viewport->rect(), 0);
}